

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

void indexLevels(xformDatabase *xdb)

{
  int iVar1;
  ulong uVar2;
  transformData *ptVar3;
  
  if (xdb != (xformDatabase *)0x0) {
    uVar2 = 0;
    ptVar3 = (transformData *)xdb;
    while( true ) {
      ptVar3 = ptVar3->next;
      iVar1 = (int)uVar2;
      if (ptVar3 == (transformData *)0x0) break;
      if (ptVar3->type - 1U < 2) {
        ptVar3->num = iVar1;
        xdb->level[uVar2] = ptVar3;
        uVar2 = (ulong)(iVar1 + 1);
      }
    }
    xdb->nlevs = iVar1;
  }
  return;
}

Assistant:

void indexLevels(xformDatabase* xdb) {
   transformData* xform = NULL;
   int n = 0;
   
   if (xdb) {
      n = 0;
      for(xform = xdb->xforms; xform; xform = xform->next) {
         if (xform->type == ROTxform || xform->type == TRANSxform) {
            /* the NULL transformation does not get indexed (it is not a scan dimension) */
	    xform->num = n;
            xdb->level[n++] = xform;
         }
      }
      xdb->nlevs = n;
   }
}